

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sa_sampler.hpp
# Opt level: O2

void __thiscall
openjij::sampler::SASampler<openjij::graph::IsingPolynomialModel<double>_>::SASampler
          (SASampler<openjij::graph::IsingPolynomialModel<double>_> *this,
          IsingPolynomialModel<double> *model)

{
  uint uVar1;
  random_device rStack_1398;
  
  graph::IsingPolynomialModel<double>::IsingPolynomialModel(&this->model_,model);
  this->num_sweeps_ = 1000;
  this->num_reads_ = 1;
  this->num_threads_ = 1;
  this->beta_min_ = 1.0;
  this->beta_max_ = 1.0;
  this->update_method_ = METROPOLIS;
  this->random_number_engine_ = XORSHIFT;
  this->schedule_ = GEOMETRIC;
  std::random_device::random_device(&rStack_1398);
  uVar1 = std::random_device::_M_getval();
  std::random_device::~random_device(&rStack_1398);
  this->seed_ = (ulong)uVar1;
  (this->samples_).
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samples_).
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samples_).
  super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SASampler(const ModelType &model): model_(model) {}